

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawNegativeViewportHeightTests.cpp
# Opt level: O0

bool __thiscall
vkt::Draw::anon_unknown_0::NegativeViewportHeightTestInstance::isCulled
          (NegativeViewportHeightTestInstance *this,VkFrontFace triangleFace)

{
  bool bVar1;
  bool isFrontFacing;
  VkFrontFace triangleFace_local;
  NegativeViewportHeightTestInstance *this_local;
  
  bVar1 = triangleFace == (this->m_params).frontFace;
  if (((this->m_params).cullMode == VK_CULL_MODE_FRONT_BIT) && (bVar1)) {
    this_local._7_1_ = true;
  }
  else if (((this->m_params).cullMode != VK_CULL_MODE_BACK_BIT) || (bVar1)) {
    this_local._7_1_ = (this->m_params).cullMode == VK_CULL_MODE_FRONT_AND_BACK;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool NegativeViewportHeightTestInstance::isCulled (const VkFrontFace triangleFace) const
{
	const bool isFrontFacing = (triangleFace == m_params.frontFace);

	if (m_params.cullMode == VK_CULL_MODE_FRONT_BIT && isFrontFacing)
		return true;
	if (m_params.cullMode == VK_CULL_MODE_BACK_BIT  && !isFrontFacing)
		return true;

	return m_params.cullMode == VK_CULL_MODE_FRONT_AND_BACK;
}